

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmList.h
# Opt level: O2

cmList * __thiscall
cmList::
insert_items<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
          (cmList *this,index_type index,
          __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          first,__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                last,ExpandElements expandElements,EmptyElements emptyElements)

{
  size_type sVar1;
  
  sVar1 = ComputeInsertIndex(this,index,true);
  Insert<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
            (&this->Values,
             (this->Values).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start + sVar1,first,last,expandElements,
             emptyElements);
  return this;
}

Assistant:

cmList& insert_items(index_type index, InputIterator first,
                       InputIterator last,
                       ExpandElements expandElements = ExpandElements::Yes,
                       EmptyElements emptyElements = EmptyElements::No)
  {
    auto const offset =
      static_cast<difference_type>(this->ComputeInsertIndex(index));
    this->insert(this->begin() + offset, first, last, expandElements,
                 emptyElements);
    return *this;
  }